

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# retInit.c
# Opt level: O2

void Abc_NtkRetimeBackwardInitialFinish
               (Abc_Ntk_t *pNtk,Abc_Ntk_t *pNtkNew,Vec_Int_t *vValuesOld,int fVerbose)

{
  Abc_Obj_t *pAVar1;
  Abc_Obj_t *pFanin;
  Vec_Int_t *vValues;
  int iVar2;
  
  for (iVar2 = 0; iVar2 < pNtk->vObjs->nSize; iVar2 = iVar2 + 1) {
    pAVar1 = Abc_NtkObj(pNtk,iVar2);
    if ((pAVar1 != (Abc_Obj_t *)0x0) && ((*(uint *)&pAVar1->field_0x14 & 0xf) == 8)) {
      pAVar1 = (pAVar1->field_6).pCopy;
      pFanin = Abc_NtkCreateObj(pNtkNew,ABC_OBJ_PI);
      Abc_ObjAddFanin(pAVar1,pFanin);
    }
  }
  Abc_NtkAddDummyPiNames(pNtkNew);
  Abc_NtkAddDummyPoNames(pNtkNew);
  iVar2 = Abc_NtkCheck(pNtkNew);
  if (iVar2 == 0) {
    fwrite("Abc_NtkRetimeBackwardInitialFinish(): Network check has failed.\n",0x40,1,_stdout);
  }
  vValues = Abc_NtkRetimeInitialValues(pNtkNew,vValuesOld,fVerbose);
  Abc_NtkRetimeInsertLatchValues(pNtk,vValues);
  if (vValues != (Vec_Int_t *)0x0) {
    free(vValues->pArray);
    free(vValues);
    return;
  }
  return;
}

Assistant:

void Abc_NtkRetimeBackwardInitialFinish( Abc_Ntk_t * pNtk, Abc_Ntk_t * pNtkNew, Vec_Int_t * vValuesOld, int fVerbose )
{
    Vec_Int_t * vValuesNew;
    Abc_Obj_t * pObj;
    int i;
    // create PIs corresponding to the initial values
    Abc_NtkForEachObj( pNtk, pObj, i )
        if ( Abc_ObjIsLatch(pObj) )
            Abc_ObjAddFanin( pObj->pCopy, Abc_NtkCreatePi(pNtkNew) );
    // assign dummy node names
    Abc_NtkAddDummyPiNames( pNtkNew );
    Abc_NtkAddDummyPoNames( pNtkNew );
    // check the network
    if ( !Abc_NtkCheck( pNtkNew ) )
        fprintf( stdout, "Abc_NtkRetimeBackwardInitialFinish(): Network check has failed.\n" );
    // derive new initial values
    vValuesNew = Abc_NtkRetimeInitialValues( pNtkNew, vValuesOld, fVerbose );
    // insert new initial values
    Abc_NtkRetimeInsertLatchValues( pNtk, vValuesNew );
    if ( vValuesNew ) Vec_IntFree( vValuesNew );
}